

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

double __thiscall
HighsNodeQueue::emplaceNode
          (HighsNodeQueue *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgs,
          vector<int,_std::allocator<int>_> *branchPositions,double lower_bound,double estimate,
          HighsInt depth)

{
  bool bVar1;
  size_type *psVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__to;
  HighsNodeQueue *in_RDI;
  double extraout_XMM0_Qa;
  int64_t pos;
  OpenNode *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff38;
  priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>
  *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff4c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_ffffffffffffff58;
  vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
  *in_stack_ffffffffffffff60;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_ffffffffffffff68;
  OpenNode *in_stack_ffffffffffffff70;
  char *local_38;
  
  bVar1 = std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::
          empty((priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>
                 *)0x659bbe);
  if (bVar1) {
    local_38 = (char *)std::
                       vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
                       size(&in_RDI->nodes);
    std::vector<HighsNodeQueue::OpenNode,std::allocator<HighsNodeQueue::OpenNode>>::
    emplace_back<std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>,std::vector<int,std::allocator<int>>,double&,double&,int&>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (double *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __to = extraout_RDX;
  }
  else {
    psVar2 = (size_type *)
             std::
             priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::
             top((priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>
                  *)0x659c23);
    local_38 = (char *)*psVar2;
    std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::pop
              (in_stack_ffffffffffffff40);
    OpenNode::OpenNode(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                       (double)in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff4c);
    std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::operator[]
              (&in_RDI->nodes,(size_type)local_38);
    OpenNode::operator=((OpenNode *)in_RDI,in_stack_ffffffffffffff28);
    OpenNode::~OpenNode((OpenNode *)in_RDI);
    __to = extraout_RDX_00;
  }
  link(in_RDI,local_38,__to);
  return extraout_XMM0_Qa;
}

Assistant:

double HighsNodeQueue::emplaceNode(std::vector<HighsDomainChange>&& domchgs,
                                   std::vector<HighsInt>&& branchPositions,
                                   double lower_bound, double estimate,
                                   HighsInt depth) {
  int64_t pos;

  assert(estimate != kHighsInf);

  if (freeslots.empty()) {
    pos = nodes.size();
    nodes.emplace_back(std::move(domchgs), std::move(branchPositions),
                       lower_bound, estimate, depth);
  } else {
    pos = freeslots.top();
    freeslots.pop();
    nodes[pos] = OpenNode(std::move(domchgs), std::move(branchPositions),
                          lower_bound, estimate, depth);
  }

  assert(nodes[pos].lower_bound == lower_bound);
  assert(nodes[pos].estimate == estimate);
  assert(nodes[pos].depth == depth);

  return link(pos);
}